

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
dynet::AffineTransform::forward_dev_impl<dynet::Device_CPU>
          (AffineTransform *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  size_t __n;
  uint uVar1;
  pointer ppTVar2;
  float *pfVar3;
  float *__src;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint b;
  uint uVar7;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *local_d8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_d0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_b0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_70;
  
  ppTVar2 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
  if ((uVar4 & 8) == 0) {
    __assert_fail("xs.size() % 2 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0xe6,
                  "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  if (uVar4 == 8) {
    fx->v = (*ppTVar2)->v;
  }
  else {
    uVar7 = (fx->d).bd;
    uVar5 = ((*ppTVar2)->d).bd;
    if (uVar7 == uVar5) {
      local_70.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      ._0_16_ = Tensor::tvec(*ppTVar2);
      local_b0 = Tensor::tvec(fx);
      local_d0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)&local_b0;
      local_d0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = (PointerType)dev->edevice;
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                   *)&local_d0,
                  (TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)&local_70);
    }
    else {
      if ((uVar7 == 1) || (uVar5 != 1)) {
        __assert_fail("xs[0]->d.bd == 1 && fx.d.bd != 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                      ,0xef,
                      "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                     );
      }
      uVar5 = Dim::batch_size(&fx->d);
      uVar7 = (fx->d).bd;
      pfVar3 = fx->v;
      __n = (ulong)uVar5 * 4;
      lVar6 = 0;
      __src = (*(xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start)->v;
      do {
        memcpy((void *)((long)pfVar3 + lVar6),__src,__n);
        lVar6 = lVar6 + __n;
      } while ((ulong)uVar7 * (ulong)uVar5 * 4 != lVar6);
    }
    uVar4 = 1;
    while( true ) {
      ppTVar2 = (xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(xs->
                        super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3) <= uVar4)
      break;
      uVar5 = (int)uVar4 + 1;
      uVar7 = (ppTVar2[uVar4]->d).bd;
      if ((uVar7 == 1) && ((ppTVar2[uVar5]->d).bd == (fx->d).bd)) {
        Tensor::operator*(&local_d0,ppTVar2[uVar4]);
        Tensor::colbatch_matrix
                  ((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                   &local_b0,
                   (xs->
                   super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar5]);
        Eigen::
        Product<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
        ::Product(&local_70,&local_d0,
                  (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)&local_b0
                 );
        Tensor::colbatch_matrix(&local_90,fx);
        local_d8 = &local_90;
        Eigen::
        NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
        ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
                      *)&local_d8,
                     (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)&local_70);
      }
      else {
        uVar1 = (ppTVar2[uVar5]->d).bd;
        if ((uVar1 != 1) && (uVar1 != uVar7)) {
          __assert_fail("xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd",
                        "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                        ,0x108,
                        "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                       );
        }
        for (uVar7 = 0; uVar7 < (fx->d).bd; uVar7 = uVar7 + 1) {
          Tensor::batch_matrix
                    (&local_d0,
                     (xs->
                     super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar4],uVar7);
          Tensor::batch_matrix
                    ((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                     &local_b0,
                     (xs->
                     super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar5],uVar7);
          Eigen::
          Product<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::Product(&local_70,&local_d0,
                    (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                    &local_b0);
          Tensor::batch_matrix(&local_90,fx,uVar7);
          local_d8 = &local_90;
          Eigen::
          NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
          ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
                        *)&local_d8,
                       (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)&local_70);
        }
      }
      uVar4 = (ulong)((int)uVar4 + 2);
    }
  }
  return;
}

Assistant:

void AffineTransform::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() % 2 == 1);
  if (xs.size() == 1) {
    fx.v = xs[0]->v;
    return;
  } else {
    // Add the first matrix
    if(fx.d.bd == xs[0]->d.bd) {
      fx.tvec().device(*dev.edevice) = xs[0]->tvec();
    } else {
      assert(xs[0]->d.bd == 1 && fx.d.bd != 1);
#ifdef __CUDACC__
      Eigen::array<int, 3> bcast; bcast[0] = bcast[1] = 1; bcast[2] = fx.d.bd;
      fx.tb<2>().device(*dev.edevice) = xs[0]->tb<2>().broadcast(bcast);
#else
      size_t batch_size = fx.d.batch_size();
      float *curr_ptr = fx.v, *end_ptr = curr_ptr + batch_size * fx.d.bd, *in_ptr = xs[0]->v;
      do {
        memcpy(curr_ptr, in_ptr, sizeof(float)*batch_size);
        curr_ptr += batch_size;
      } while(curr_ptr != end_ptr);
#endif
    }

    // Perform multiplication
#ifdef __CUDACC__
    for (unsigned i = 1; i < xs.size(); i += 2)
      // fx = (acc_sclar)*fx + xs[0] * xs[1]
      CUDAMatrixMultiply(dev, *xs[i], *xs[i + 1], fx, kSCALAR_ONE);
#else
    // Multiply
    for (unsigned i = 1; i < xs.size(); i += 2) {
      if(xs[i]->d.bd == 1 && xs[i+1]->d.bd == fx.d.bd) {
        fx.colbatch_matrix().noalias() += **xs[i] * xs[i+1]->colbatch_matrix();
      } else {
        assert(xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd);
        for(unsigned b = 0; b < fx.d.bd; ++b) {
          fx.batch_matrix(b).noalias() += xs[i]->batch_matrix(b) * xs[i+1]->batch_matrix(b);
        }
      }
    }
#endif
  }
}